

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O2

mode_t get_mode(char *s)

{
  byte bVar1;
  mode_t mVar2;
  
  mVar2 = 0;
  while( true ) {
    bVar1 = *s;
    if (bVar1 == 0) {
      return mVar2;
    }
    if ((bVar1 & 0xf8) != 0x30) break;
    mVar2 = (uint)(byte)(bVar1 - 0x30) + mVar2 * 8;
    s = (char *)((byte *)s + 1);
  }
  return 0xffffffff;
}

Assistant:

static mode_t get_mode(const char *s) {
    mode_t mode = 0;
    while (*s) {
        if (*s >= '0' && *s <= '7') {
            mode = (mode<<3) | (*s-'0');
        } else {
            return -1;
        }
        s++;
    }
    return mode;
}